

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImParseFormatFindEnd(char *fmt)

{
  char cVar1;
  char c;
  uint ignored_lowercase_mask;
  uint ignored_uppercase_mask;
  char *fmt_local;
  
  _ignored_lowercase_mask = fmt;
  fmt_local = fmt;
  if (*fmt == '%') {
    for (; cVar1 = *_ignored_lowercase_mask, cVar1 != '\0';
        _ignored_lowercase_mask = _ignored_lowercase_mask + 1) {
      if ((('@' < cVar1) && (cVar1 < '[')) && ((1 << (cVar1 + 0xbfU & 0x1f) & 0x900U) == 0)) {
        return _ignored_lowercase_mask + 1;
      }
      if ((('`' < cVar1) && (cVar1 < '{')) && ((1 << (cVar1 + 0x9fU & 0x1f) & 0x2480a80U) == 0)) {
        return _ignored_lowercase_mask + 1;
      }
    }
    fmt_local = _ignored_lowercase_mask;
  }
  return fmt_local;
}

Assistant:

const char* ImParseFormatFindEnd(const char* fmt)
{
    // Printf/scanf types modifiers: I/L/h/j/l/t/w/z. Other uppercase letters qualify as types aka end of the format.
    if (fmt[0] != '%')
        return fmt;
    const unsigned int ignored_uppercase_mask = (1 << ('I'-'A')) | (1 << ('L'-'A'));
    const unsigned int ignored_lowercase_mask = (1 << ('h'-'a')) | (1 << ('j'-'a')) | (1 << ('l'-'a')) | (1 << ('t'-'a')) | (1 << ('w'-'a')) | (1 << ('z'-'a'));
    for (char c; (c = *fmt) != 0; fmt++)
    {
        if (c >= 'A' && c <= 'Z' && ((1 << (c - 'A')) & ignored_uppercase_mask) == 0)
            return fmt + 1;
        if (c >= 'a' && c <= 'z' && ((1 << (c - 'a')) & ignored_lowercase_mask) == 0)
            return fmt + 1;
    }
    return fmt;
}